

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringhelper.cpp
# Opt level: O3

void strcpy_safe(char *destination,char *source,int maxLength)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (maxLength < 1) {
    uVar3 = 0;
  }
  else {
    uVar2 = 0;
    do {
      cVar1 = source[uVar2];
      destination[uVar2] = cVar1;
      uVar3 = uVar2;
      if (cVar1 == '\0') break;
      uVar2 = uVar2 + 1;
      uVar3 = (ulong)(uint)maxLength;
    } while ((uint)maxLength != uVar2);
    uVar3 = uVar3 & 0xffffffff;
  }
  destination[uVar3] = '\0';
  return;
}

Assistant:

void strcpy_safe( char *destination, char const*source, int maxLength ) {
    int i = 0;
    for( i = 0; i < maxLength; i++ ) {
        destination[i] = source[i];
        if( source[i] == 0 ) {
            break;
        }
    }
    destination[i] = 0;
}